

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O1

void __thiscall icu_63::Locale::setToBogus(Locale *this)

{
  if (this->baseName != this->fullName) {
    uprv_free_63(this->baseName);
  }
  this->baseName = (char *)0x0;
  if (this->fullName != this->fullNameBuffer) {
    uprv_free_63(this->fullName);
    this->fullName = this->fullNameBuffer;
  }
  this->fullNameBuffer[0] = '\0';
  this->language[0] = '\0';
  this->script[0] = '\0';
  this->country[0] = '\0';
  this->fIsBogus = '\x01';
  this->variantBegin = 0;
  return;
}

Assistant:

void
Locale::setToBogus() {
    /* Free our current storage */
    if(baseName != fullName) {
        uprv_free(baseName);
    }
    baseName = NULL;
    if(fullName != fullNameBuffer) {
        uprv_free(fullName);
        fullName = fullNameBuffer;
    }
    *fullNameBuffer = 0;
    *language = 0;
    *script = 0;
    *country = 0;
    fIsBogus = TRUE;
    variantBegin = 0;
}